

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O0

void Diligent::LoadShaderCodeVariableDesc
               (Compiler *Compiler,TypeID *TypeID,Bitset *Decoration,bool IsHLSLSource,
               ShaderCodeVariableDescX *TypeDesc)

{
  SPIRType *pSVar1;
  TypeID *pTVar2;
  SHADER_CODE_BASIC_TYPE SVar3;
  byte bVar4;
  bool bVar5;
  string *psVar6;
  uint *puVar7;
  ulong uVar8;
  size_t sVar9;
  Char *Message;
  TypedID<(diligent_spirv_cross::Types)1> *TypeID_00;
  Bitset *Decoration_00;
  ShaderCodeVariableDescX *TypeDesc_00;
  SHADER_SOURCE_LANGUAGE Language;
  uint local_134;
  undefined1 local_ff;
  undefined1 local_fd;
  undefined1 local_f8 [8];
  string msg;
  size_t idx;
  undefined1 local_c8 [8];
  ShaderCodeVariableDesc VarDesc;
  uint32_t i;
  ID local_64;
  string local_60;
  uint32_t local_3c;
  SPIRType *local_38;
  SPIRType *SpvType;
  ShaderCodeVariableDescX *TypeDesc_local;
  Bitset *pBStack_20;
  bool IsHLSLSource_local;
  Bitset *Decoration_local;
  TypeID *TypeID_local;
  Compiler *Compiler_local;
  
  local_3c = TypeID->id;
  SpvType = (SPIRType *)TypeDesc;
  TypeDesc_local._7_1_ = IsHLSLSource;
  pBStack_20 = Decoration;
  Decoration_local = (Bitset *)TypeID;
  TypeID_local = (TypeID *)Compiler;
  local_38 = diligent_spirv_cross::Compiler::get_type(Compiler,(TypeID)local_3c);
  if (local_38->basetype == Struct) {
    *(undefined1 *)&SpvType->basetype = Short;
  }
  else if ((local_38->vecsize < 2) || (local_38->columns < 2)) {
    if (local_38->vecsize < 2) {
      *(undefined1 *)&SpvType->basetype = Void;
    }
    else {
      *(undefined1 *)&SpvType->basetype = Boolean;
    }
  }
  else {
    bVar5 = diligent_spirv_cross::Bitset::get(pBStack_20,4);
    if (bVar5) {
      local_fd = UByte;
      if ((TypeDesc_local._7_1_ & 1) == 0) {
        local_fd = SByte;
      }
      *(undefined1 *)&SpvType->basetype = local_fd;
    }
    else {
      local_ff = SByte;
      if ((TypeDesc_local._7_1_ & 1) == 0) {
        local_ff = UByte;
      }
      *(undefined1 *)&SpvType->basetype = local_ff;
    }
  }
  if ((char)SpvType->basetype != Short) {
    SVar3 = SpirvBaseTypeToShaderCodeBasicType(local_38->basetype);
    *(SHADER_CODE_BASIC_TYPE *)((long)&SpvType->basetype + 1) = SVar3;
    bVar4 = StaticCast<unsigned_char,unsigned_int>(&local_38->vecsize);
    *(byte *)((long)&SpvType->basetype + 2) = bVar4;
    bVar4 = StaticCast<unsigned_char,unsigned_int>(&local_38->columns);
    *(byte *)((long)&SpvType->basetype + 3) = bVar4;
    if ((TypeDesc_local._7_1_ & 1) != 0) {
      std::swap<unsigned_char>
                ((byte *)((long)&SpvType->basetype + 2),(byte *)((long)&SpvType->basetype + 3));
    }
  }
  pTVar2 = TypeID_local;
  pSVar1 = SpvType;
  diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>::
  TypedID<(diligent_spirv_cross::Types)1>
            (&local_64,(TypedID<(diligent_spirv_cross::Types)1> *)Decoration_local);
  psVar6 = diligent_spirv_cross::Compiler::get_name_abi_cxx11_((Compiler *)pTVar2,local_64);
  std::__cxx11::string::string((string *)&local_60,(string *)psVar6);
  ShaderCodeVariableDescX::SetTypeName((ShaderCodeVariableDescX *)pSVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pTVar2 = TypeID_local;
  pSVar1 = SpvType;
  if ((*(long *)&(SpvType->super_IVariant).self == 0) ||
     (**(char **)&(SpvType->super_IVariant).self == '\0')) {
    diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>::
    TypedID<(diligent_spirv_cross::Types)1>
              ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&VarDesc.pMembers + 4),
               &local_38->parent_type);
    psVar6 = diligent_spirv_cross::Compiler::get_name_abi_cxx11_
                       ((Compiler *)pTVar2,VarDesc.pMembers._4_4_);
    std::__cxx11::string::string((string *)&i,(string *)psVar6);
    ShaderCodeVariableDescX::SetTypeName((ShaderCodeVariableDescX *)pSVar1,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
  }
  if ((*(long *)&(SpvType->super_IVariant).self == 0) ||
     (**(char **)&(SpvType->super_IVariant).self == '\0')) {
    Language = SHADER_SOURCE_LANGUAGE_GLSL;
    if ((TypeDesc_local._7_1_ & 1) != 0) {
      Language = SHADER_SOURCE_LANGUAGE_HLSL;
    }
    ShaderCodeVariableDescX::SetDefaultTypeName((ShaderCodeVariableDescX *)SpvType,Language);
  }
  bVar5 = diligent_spirv_cross::VectorView<unsigned_int>::empty
                    (&(local_38->array).super_VectorView<unsigned_int>);
  if (bVar5) {
    local_134 = 0;
  }
  else {
    puVar7 = diligent_spirv_cross::VectorView<unsigned_int>::operator[]
                       (&(local_38->array).super_VectorView<unsigned_int>,0);
    local_134 = *puVar7;
  }
  SpvType->vecsize = local_134;
  for (VarDesc.pMembers._0_4_ = 0; uVar8 = (ulong)(uint)VarDesc.pMembers,
      sVar9 = diligent_spirv_cross::
              VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::size
                        (&(local_38->member_types).
                          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                        ), uVar8 < sVar9; VarDesc.pMembers._0_4_ = (uint)VarDesc.pMembers + 1) {
    ShaderCodeVariableDesc::ShaderCodeVariableDesc((ShaderCodeVariableDesc *)local_c8);
    diligent_spirv_cross::Compiler::get_member_name_abi_cxx11_
              ((Compiler *)TypeID_local,(TypeID)(uint32_t)Decoration_local->lower,
               (uint)VarDesc.pMembers);
    local_c8 = (undefined1  [8])std::__cxx11::string::c_str();
    if (*(char *)local_c8 == '\0') {
      diligent_spirv_cross::Compiler::get_member_name_abi_cxx11_
                ((Compiler *)TypeID_local,(TypeID)(local_38->parent_type).id,(uint)VarDesc.pMembers)
      ;
      local_c8 = (undefined1  [8])std::__cxx11::string::c_str();
    }
    VarDesc.TypeName._4_4_ =
         diligent_spirv_cross::Compiler::type_struct_member_offset
                   ((Compiler *)TypeID_local,local_38,(uint)VarDesc.pMembers);
    msg.field_2._8_8_ =
         ShaderCodeVariableDescX::AddMember
                   ((ShaderCodeVariableDescX *)SpvType,(ShaderCodeVariableDesc *)local_c8);
    if ((char (*) [9])msg.field_2._8_8_ != (char (*) [9])(ulong)(uint)VarDesc.pMembers) {
      FormatString<char[26],char[9]>
                ((string *)local_f8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"idx == i",(char (*) [9])(ulong)(uint)VarDesc.pMembers);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"LoadShaderCodeVariableDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x15f);
      std::__cxx11::string::~string((string *)local_f8);
    }
    pTVar2 = TypeID_local;
    TypeID_00 = diligent_spirv_cross::
                VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::
                operator[](&(local_38->member_types).
                            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                           ,(ulong)(uint)VarDesc.pMembers);
    Decoration_00 =
         diligent_spirv_cross::Compiler::get_member_decoration_bitset
                   ((Compiler *)TypeID_local,(TypeID)(uint32_t)Decoration_local->lower,
                    (uint)VarDesc.pMembers);
    bVar4 = TypeDesc_local._7_1_;
    TypeDesc_00 = ShaderCodeVariableDescX::GetMember
                            ((ShaderCodeVariableDescX *)SpvType,(ulong)(uint)VarDesc.pMembers);
    LoadShaderCodeVariableDesc
              ((Compiler *)pTVar2,TypeID_00,Decoration_00,(bool)(bVar4 & 1),TypeDesc_00);
  }
  return;
}

Assistant:

void LoadShaderCodeVariableDesc(const diligent_spirv_cross::Compiler& Compiler,
                                const diligent_spirv_cross::TypeID&   TypeID,
                                const diligent_spirv_cross::Bitset&   Decoration,
                                bool                                  IsHLSLSource,
                                ShaderCodeVariableDescX&              TypeDesc)
{
    const auto& SpvType = Compiler.get_type(TypeID);
    if (SpvType.basetype == diligent_spirv_cross::SPIRType::Struct)
    {
        TypeDesc.Class = SHADER_CODE_VARIABLE_CLASS_STRUCT;
    }
    else if (SpvType.vecsize > 1 && SpvType.columns > 1)
    {
        if (Decoration.get(spv::Decoration::DecorationRowMajor))
            TypeDesc.Class = IsHLSLSource ? SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS : SHADER_CODE_VARIABLE_CLASS_MATRIX_ROWS;
        else
            TypeDesc.Class = IsHLSLSource ? SHADER_CODE_VARIABLE_CLASS_MATRIX_ROWS : SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    }
    else if (SpvType.vecsize > 1)
    {
        TypeDesc.Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    }
    else
    {
        TypeDesc.Class = SHADER_CODE_VARIABLE_CLASS_SCALAR;
    }

    if (TypeDesc.Class != SHADER_CODE_VARIABLE_CLASS_STRUCT)
    {
        TypeDesc.BasicType  = SpirvBaseTypeToShaderCodeBasicType(SpvType.basetype);
        TypeDesc.NumRows    = StaticCast<decltype(TypeDesc.NumRows)>(SpvType.vecsize);
        TypeDesc.NumColumns = StaticCast<decltype(TypeDesc.NumColumns)>(SpvType.columns);
        if (IsHLSLSource)
            std::swap(TypeDesc.NumRows, TypeDesc.NumColumns);
    }

    TypeDesc.SetTypeName(Compiler.get_name(TypeID));
    if (TypeDesc.TypeName == nullptr || TypeDesc.TypeName[0] == '\0')
        TypeDesc.SetTypeName(Compiler.get_name(SpvType.parent_type));
    if (TypeDesc.TypeName == nullptr || TypeDesc.TypeName[0] == '\0')
        TypeDesc.SetDefaultTypeName(IsHLSLSource ? SHADER_SOURCE_LANGUAGE_HLSL : SHADER_SOURCE_LANGUAGE_GLSL);

    TypeDesc.ArraySize = !SpvType.array.empty() ? SpvType.array[0] : 0;

    for (uint32_t i = 0; i < SpvType.member_types.size(); ++i)
    {
        ShaderCodeVariableDesc VarDesc;
        VarDesc.Name = Compiler.get_member_name(TypeID, i).c_str();
        if (VarDesc.Name[0] == '\0')
            VarDesc.Name = Compiler.get_member_name(SpvType.parent_type, i).c_str();

        VarDesc.Offset = Compiler.type_struct_member_offset(SpvType, i);

        auto idx = TypeDesc.AddMember(VarDesc);
        VERIFY_EXPR(idx == i);
        LoadShaderCodeVariableDesc(Compiler, SpvType.member_types[i], Compiler.get_member_decoration_bitset(TypeID, i), IsHLSLSource, TypeDesc.GetMember(i));
    }
}